

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTDMT_computeOverlapSize(ZSTD_CCtx_params *params)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  int iVar5;
  
  uVar2 = params->overlapLog;
  if (9 < uVar2) {
    __assert_fail("0 <= ovlog && ovlog <= 9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4f14,"int ZSTDMT_overlapLog(int, ZSTD_strategy)");
  }
  if (uVar2 == 1) {
    uVar2 = 0;
    iVar5 = 8;
  }
  else {
    if (uVar2 == 0) {
      uVar2 = ZSTDMT_overlapLog_default((params->cParams).strategy);
    }
    iVar5 = 9 - uVar2;
    uVar2 = (params->cParams).windowLog - iVar5;
  }
  if ((params->ldmParams).enableLdm != 0) {
    uVar1 = (params->cParams).windowLog;
    uVar3 = ZSTDMT_computeTargetJobLog(params);
    uVar2 = uVar3 - 2;
    if (uVar1 < uVar3 - 2) {
      uVar2 = uVar1;
    }
    uVar2 = uVar2 - iVar5;
  }
  if (uVar2 < 0x20) {
    sVar4 = 0;
    if (uVar2 != 0) {
      sVar4 = 1L << ((byte)uVar2 & 0x3f);
    }
    return sVar4;
  }
  __assert_fail("0 <= ovLog && ovLog <= ZSTD_WINDOWLOG_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x4f26,"size_t ZSTDMT_computeOverlapSize(const ZSTD_CCtx_params *)");
}

Assistant:

static size_t ZSTDMT_computeOverlapSize(const ZSTD_CCtx_params* params)
{
    int const overlapRLog = 9 - ZSTDMT_overlapLog(params->overlapLog, params->cParams.strategy);
    int ovLog = (overlapRLog >= 8) ? 0 : (params->cParams.windowLog - overlapRLog);
    assert(0 <= overlapRLog && overlapRLog <= 8);
    if (params->ldmParams.enableLdm) {
        /* In Long Range Mode, the windowLog is typically oversized.
         * In which case, it's preferable to determine the jobSize
         * based on chainLog instead.
         * Then, ovLog becomes a fraction of the jobSize, rather than windowSize */
        ovLog = MIN(params->cParams.windowLog, ZSTDMT_computeTargetJobLog(params) - 2)
                - overlapRLog;
    }
    assert(0 <= ovLog && ovLog <= ZSTD_WINDOWLOG_MAX);
    DEBUGLOG(4, "overlapLog : %i", params->overlapLog);
    DEBUGLOG(4, "overlap size : %i", 1 << ovLog);
    return (ovLog==0) ? 0 : (size_t)1 << ovLog;
}